

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O2

KFLOAT32 * __thiscall KDIS::DATA_TYPE::Vector::operator[](Vector *this,KUINT16 i)

{
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  
  if (i < 3) {
    return &this->m_f32X + (i & 0x3fff);
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"operator[]",&local_39);
  KException::KException(this_00,&local_38,7);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

KFLOAT32 &Vector::operator[](KUINT16 i) noexcept(false)
{
    switch( i )
    {
        case 0: 	return m_f32X;
        case 1:		return m_f32Y;
        case 2:		return m_f32Z;
        default:	throw KException( __FUNCTION__, OUT_OF_BOUNDS );
    }
}